

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O1

void DES_encrypt2(uint *data,DES_key_schedule *ks,int enc)

{
  uint uVar1;
  long lVar2;
  _union_772 *p_Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar4 = *data << 3 | *data >> 0x1d;
  uVar5 = data[1] << 3 | data[1] >> 0x1d;
  if (enc == 0) {
    uVar6 = *(uint *)((long)ks->ks + 0x7c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar7 = ks->ks[0xf].deslong[0] ^ uVar4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[0xe].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x74) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[0xd].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x6c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[0xc].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 100) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[0xb].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x5c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[10].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x54) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[9].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x4c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[8].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x44) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[7].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x3c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[6].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x34) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[5].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x2c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[4].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x24) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[3].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x1c) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[2].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x14) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[1].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0xc) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    lVar2 = 4;
    p_Var3 = ks->ks;
  }
  else {
    uVar6 = ks->ks[0].deslong[1] ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar7 = ks->ks[0].deslong[0] ^ uVar4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[1].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0xc) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[2].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x14) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[3].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x1c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[4].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x24) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[5].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x2c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[6].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x34) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[7].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x3c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[8].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x44) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[9].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x4c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[10].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x54) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[0xb].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x5c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[0xc].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 100) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    uVar7 = ks->ks[0xd].deslong[0] ^ uVar5;
    uVar6 = *(uint *)((long)ks->ks + 0x6c) ^ uVar5;
    uVar1 = uVar6 >> 4;
    uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
    uVar7 = ks->ks[0xe].deslong[0] ^ uVar4;
    uVar6 = *(uint *)((long)ks->ks + 0x74) ^ uVar4;
    uVar1 = uVar6 >> 4;
    uVar5 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar5;
    lVar2 = 0x7c;
    p_Var3 = ks->ks + 0xf;
  }
  uVar6 = *(uint *)((long)ks->ks + lVar2) ^ uVar5;
  uVar1 = uVar6 >> 4;
  uVar7 = p_Var3->deslong[0] ^ uVar5;
  uVar4 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar7 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar7 >> 8 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar7 >> 0x10 & 0xfc)) ^
          DES_SPtrans[6][uVar7 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar1 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar1 & 0xfc00) >> 8)) ^
          *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar1 & 0xfc0000) >> 0x10)) ^
          DES_SPtrans[7][(uVar6 << 0x1c | uVar1) >> 0x1a] ^ uVar4;
  *data = uVar5 << 0x1d | uVar5 >> 3;
  data[1] = uVar4 << 0x1d | uVar4 >> 3;
  return;
}

Assistant:

static void DES_encrypt2(uint32_t data[2], const DES_key_schedule *ks,
                         int enc) {
  uint32_t l, r, t, u;

  r = data[0];
  l = data[1];

  // Things have been modified so that the initial rotate is done outside the
  // loop.  This required the DES_SPtrans values in sp.h to be rotated 1 bit to
  // the right. One perl script later and things have a 5% speed up on a
  // sparc2. Thanks to Richard Outerbridge <71755.204@CompuServe.COM> for
  // pointing this out.
  // clear the top bits on machines with 8byte longs
  r = CRYPTO_rotr_u32(r, 29);
  l = CRYPTO_rotr_u32(l, 29);

  // I don't know if it is worth the effort of loop unrolling the
  // inner loop
  if (enc) {
    D_ENCRYPT(ks, l, r, 0);
    D_ENCRYPT(ks, r, l, 1);
    D_ENCRYPT(ks, l, r, 2);
    D_ENCRYPT(ks, r, l, 3);
    D_ENCRYPT(ks, l, r, 4);
    D_ENCRYPT(ks, r, l, 5);
    D_ENCRYPT(ks, l, r, 6);
    D_ENCRYPT(ks, r, l, 7);
    D_ENCRYPT(ks, l, r, 8);
    D_ENCRYPT(ks, r, l, 9);
    D_ENCRYPT(ks, l, r, 10);
    D_ENCRYPT(ks, r, l, 11);
    D_ENCRYPT(ks, l, r, 12);
    D_ENCRYPT(ks, r, l, 13);
    D_ENCRYPT(ks, l, r, 14);
    D_ENCRYPT(ks, r, l, 15);
  } else {
    D_ENCRYPT(ks, l, r, 15);
    D_ENCRYPT(ks, r, l, 14);
    D_ENCRYPT(ks, l, r, 13);
    D_ENCRYPT(ks, r, l, 12);
    D_ENCRYPT(ks, l, r, 11);
    D_ENCRYPT(ks, r, l, 10);
    D_ENCRYPT(ks, l, r, 9);
    D_ENCRYPT(ks, r, l, 8);
    D_ENCRYPT(ks, l, r, 7);
    D_ENCRYPT(ks, r, l, 6);
    D_ENCRYPT(ks, l, r, 5);
    D_ENCRYPT(ks, r, l, 4);
    D_ENCRYPT(ks, l, r, 3);
    D_ENCRYPT(ks, r, l, 2);
    D_ENCRYPT(ks, l, r, 1);
    D_ENCRYPT(ks, r, l, 0);
  }
  // rotate and clear the top bits on machines with 8byte longs
  data[0] = CRYPTO_rotr_u32(l, 3);
  data[1] = CRYPTO_rotr_u32(r, 3);
}